

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

Expression * __thiscall
wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
findBreakTarget(ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                *this,Name name)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  Expression **ppEVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  Expression **ppEVar8;
  Expression **ppEVar9;
  
  sVar1 = (this->expressionStack).usedFixed;
  ppEVar2 = (this->expressionStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar7 = (long)(this->expressionStack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3;
  if (lVar7 + sVar1 == 0) {
    __assert_fail("!expressionStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x1d5,
                  "Expression *wasm::ExpressionStackWalker<wasm::Flatten, wasm::UnifiedExpressionVisitor<wasm::Flatten>>::findBreakTarget(Name) [SubType = wasm::Flatten, VisitorType = wasm::UnifiedExpressionVisitor<wasm::Flatten>]"
                 );
  }
  uVar6 = (ulong)(((int)sVar1 + (int)lVar7) - 1);
  ppEVar8 = ppEVar2 + (uVar6 - 10);
  ppEVar9 = (this->expressionStack).fixed._M_elems + uVar6;
  while( true ) {
    uVar5 = (uint)uVar6;
    ppEVar4 = ppEVar8;
    if (uVar5 < 10) {
      ppEVar4 = ppEVar9;
    }
    pEVar3 = *ppEVar4;
    if (((pEVar3->_id == LoopId) || (pEVar3->_id == BlockId)) &&
       ((char *)pEVar3[1].type.id == name.super_IString.str._M_str)) break;
    ppEVar8 = ppEVar8 + -1;
    ppEVar9 = ppEVar9 + -1;
    uVar6 = (ulong)(uVar5 - 1);
    if (uVar5 == 0) {
      return (Expression *)0x0;
    }
  }
  return pEVar3;
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!expressionStack.empty());
    Index i = expressionStack.size() - 1;
    while (true) {
      auto* curr = expressionStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }